

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::PrimitiveOneofFieldGenerator::GenerateSerializedSizeCode
          (PrimitiveOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  PrimitiveOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if ($has_oneof_case$) {\n  size += com.google.protobuf.nano.CodedOutputByteBufferNano\n      .compute$capitalized_type$Size(\n          $number$, ($boxed_type$) this.$oneof_name$_);\n}\n"
                    );
  return;
}

Assistant:

void PrimitiveOneofFieldGenerator::GenerateSerializedSizeCode(
    io::Printer* printer) const {
  printer->Print(variables_,
    "if ($has_oneof_case$) {\n"
    "  size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
    "      .compute$capitalized_type$Size(\n"
    "          $number$, ($boxed_type$) this.$oneof_name$_);\n"
    "}\n");
}